

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess.cpp
# Opt level: O0

void __thiscall QProcess::setArguments(QProcess *this,QStringList *arguments)

{
  QProcessPrivate *this_00;
  char *in_RSI;
  QMessageLogger *in_RDI;
  long in_FS_OFFSET;
  QProcessPrivate *d;
  QList<QString> *in_stack_ffffffffffffffb8;
  QMessageLogger local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QProcess *)0x792bea);
  if (this_00->processState == '\0') {
    QList<QString>::operator=((QList<QString> *)this_00,in_stack_ffffffffffffffb8);
  }
  else {
    QMessageLogger::QMessageLogger
              (in_RDI,in_RSI,(int)((ulong)this_00 >> 0x20),(char *)in_stack_ffffffffffffffb8);
    QMessageLogger::warning(&local_28,"QProcess::setProgram: Process is already running");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QProcess::setArguments(const QStringList &arguments)
{
    Q_D(QProcess);
    if (d->processState != NotRunning) {
        qWarning("QProcess::setProgram: Process is already running");
        return;
    }
    d->arguments = arguments;
}